

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

int __thiscall
CVmObjHTTPRequest::getp_getBody
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  long lVar1;
  _func_int **pp_Var2;
  TadsHttpRequestHeader *this_00;
  _func_int **pp_Var3;
  anon_union_8_8_cb74652f_for_val aVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  CVmDataSource *fp;
  char *ct;
  undefined4 in_register_00000034;
  vm_val_t charset;
  
  if (getp_getBody(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar6 = __cxa_guard_acquire(&getp_getBody(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar6 != 0) {
      getp_getBody::desc.min_argc_ = 0;
      getp_getBody::desc.opt_argc_ = 0;
      getp_getBody::desc.varargs_ = 0;
      __cxa_guard_release(&getp_getBody(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getBody::desc);
  if (iVar6 == 0) {
    lVar1 = *(long *)(this->super_CVmObject).ext_;
    if (*(int *)(lVar1 + 0x68) == 0) {
      pp_Var2 = *(_func_int ***)(lVar1 + 0x60);
      if (pp_Var2 == (_func_int **)0x0) {
        retval->typ = VM_NIL;
      }
      else {
        this_00 = *(TadsHttpRequestHeader **)(lVar1 + 0x58);
        fp = (CVmDataSource *)operator_new(0x28);
        pp_Var3 = (_func_int **)pp_Var2[3];
        fp[1]._vptr_CVmDataSource = (_func_int **)pp_Var2[2];
        fp[2]._vptr_CVmDataSource = pp_Var3;
        fp[3]._vptr_CVmDataSource = (_func_int **)0x0;
        fp->_vptr_CVmDataSource = (_func_int **)&PTR__CVmStringRefSource_00343af0;
        fp[4]._vptr_CVmDataSource = pp_Var2;
        LOCK();
        pp_Var2[1] = pp_Var2[1] + 1;
        UNLOCK();
        ct = TadsHttpRequestHeader::find(this_00,"content-type");
        iVar6 = get_charset_map(ct,&charset);
        pvVar5 = sp_;
        aVar4._4_4_ = charset.val._4_4_;
        aVar4.obj = charset.val.obj;
        sp_ = sp_ + 1;
        pvVar5->typ = charset.typ;
        *(undefined4 *)&pvVar5->field_0x4 = charset._4_4_;
        pvVar5->val = aVar4;
        vVar7 = CVmObjFile::create(0,(CVmNetFile *)0x0,charset.val.obj,fp,iVar6,1,1);
        retval->typ = VM_OBJ;
        (retval->val).obj = vVar7;
        sp_ = sp_ + -1;
      }
    }
    else {
      vVar7 = CVmObjString::create(0,"overflow",8);
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar7;
    }
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getBody(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;
    StringRef *body = req->body;

    /* if the body was too large, return 'overflow' */
    if (req->overflow)
    {
        retval->set_obj(CVmObjString::create(vmg_ FALSE, "overflow", 8));
        return TRUE;
    }

    /* if there's no body, return nil */
    if (body == 0)
    {
        retval->set_nil();
        return TRUE;
    }

    /* create a data source for the body */
    CVmStringRefSource *sbody = new CVmStringRefSource(body);

    /* for a text content type, get the character mapper */
    vm_val_t charset;
    int mode = get_charset_map(vmg_ hdrs->find("content-type"), &charset);
    G_stk->push(&charset);

    /* create a File object to access the body data source */
    retval->set_obj(CVmObjFile::create(
        vmg_ FALSE, 0, charset.val.obj, sbody, mode,
        VMOBJFILE_ACCESS_READ, TRUE));

    /* discard the gc protection */
    G_stk->discard();
                                       
    /* handled */
    return TRUE;
}